

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonwriter.cpp
# Opt level: O1

bool __thiscall CJsonWriter::CanWriteDatatype(CJsonWriter *this)

{
  bool bVar1;
  
  bVar1 = true;
  if (this->m_NumStates != 0) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/jsonwriter.cpp"
                   ,0xc6,1,"json stack is empty");
    if (this->m_aStates[(long)this->m_NumStates + -1].m_Kind != '\x02') {
      dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/jsonwriter.cpp"
                     ,0xc6,(uint)(this->m_NumStates != 0),"json stack is empty");
      bVar1 = this->m_aStates[(long)this->m_NumStates + -1].m_Kind == '\x03';
    }
  }
  return bVar1;
}

Assistant:

bool CJsonWriter::CanWriteDatatype()
{
	return m_NumStates == 0
		|| TopState()->m_Kind == STATE_ARRAY
		|| TopState()->m_Kind == STATE_ATTRIBUTE;
}